

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::Renderer(Renderer *this,float sample_rate,char *args)

{
  int iVar1;
  Voice *pVVar2;
  int iVar3;
  ulong uVar4;
  
  this->rate = sample_rate;
  this->patches = (DLS_Data *)0x0;
  this->default_instrument = (Instrument *)0x0;
  this->voice = (Voice *)0x0;
  this->adjust_panning_immediately = 0;
  iVar3 = 0xff;
  if ((int)(sample_rate * 0.001) < 0xff) {
    iVar3 = (int)(sample_rate * 0.001);
  }
  iVar1 = 1;
  if (1 < iVar3) {
    iVar1 = iVar3;
  }
  this->control_ratio = iVar1;
  this->lost_notes = 0;
  this->cut_notes = 0;
  this->default_program = 0;
  this->resample_buffer_size = 0;
  this->resample_buffer = (sample_t *)0x0;
  if (*(int *)(def_instr_name + -0xc) != 0) {
    set_default_instrument(this,def_instr_name);
  }
  uVar4 = 0x10;
  if (0x10 < midi_voices.Value) {
    uVar4 = (ulong)(uint)midi_voices.Value;
  }
  this->voices = (int)uVar4;
  pVVar2 = (Voice *)operator_new__(uVar4 * 0x170);
  this->voice = pVVar2;
  this->drumchannels = 0x200;
  return;
}

Assistant:

Renderer::Renderer(float sample_rate, const char *args)
{
	// 'args' should be used to load a custom config or DMXGUS, but since setup currently requires a snd_reset call, this will need some refactoring first
	rate = sample_rate;
	patches = NULL;
	resample_buffer_size = 0;
	resample_buffer = NULL;
	voice = NULL;
	adjust_panning_immediately = false;

	control_ratio = clamp(int(rate / CONTROLS_PER_SECOND), 1, MAX_CONTROL_RATIO);

	lost_notes = 0;
	cut_notes = 0;

	default_instrument = NULL;
	default_program = DEFAULT_PROGRAM;
	if (def_instr_name.IsNotEmpty())
		set_default_instrument(def_instr_name);

	voices = MAX(*midi_voices, 16);
	voice = new Voice[voices];
	drumchannels = DEFAULT_DRUMCHANNELS;
#if 0
	FILE *f = fopen("c:\\windows\\system32\\drivers\\gm.dls", "rb");
	patches = LoadDLS(f);
	fclose(f);
#endif
}